

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O0

void __thiscall
icu_63::Normalizer2Impl::decompose
          (Normalizer2Impl *this,UChar *src,UChar *limit,UnicodeString *dest,
          int32_t destLengthEstimate,UErrorCode *errorCode)

{
  int iVar1;
  undefined1 local_78 [8];
  ReorderingBuffer buffer;
  UErrorCode *errorCode_local;
  int32_t destLengthEstimate_local;
  UnicodeString *dest_local;
  UChar *limit_local;
  UChar *src_local;
  Normalizer2Impl *this_local;
  
  errorCode_local._4_4_ = destLengthEstimate;
  if ((destLengthEstimate < 0) && (limit != (UChar *)0x0)) {
    errorCode_local._4_4_ = (uint)((long)limit - (long)src >> 1);
  }
  buffer.codePointLimit = (UChar *)errorCode;
  UnicodeString::remove(dest,(char *)src);
  ReorderingBuffer::ReorderingBuffer((ReorderingBuffer *)local_78,this,dest);
  iVar1 = ReorderingBuffer::init
                    ((ReorderingBuffer *)local_78,(EVP_PKEY_CTX *)(ulong)errorCode_local._4_4_);
  if ((char)iVar1 != '\0') {
    decompose(this,src,limit,(ReorderingBuffer *)local_78,(UErrorCode *)buffer.codePointLimit);
  }
  ReorderingBuffer::~ReorderingBuffer((ReorderingBuffer *)local_78);
  return;
}

Assistant:

void
Normalizer2Impl::decompose(const UChar *src, const UChar *limit,
                           UnicodeString &dest,
                           int32_t destLengthEstimate,
                           UErrorCode &errorCode) const {
    if(destLengthEstimate<0 && limit!=NULL) {
        destLengthEstimate=(int32_t)(limit-src);
    }
    dest.remove();
    ReorderingBuffer buffer(*this, dest);
    if(buffer.init(destLengthEstimate, errorCode)) {
        decompose(src, limit, &buffer, errorCode);
    }
}